

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
          (cmCPackPropertiesGenerator *this,cmLocalGenerator *lg,cmInstalledFile *installedFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  allocator<char> local_49;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  cmInstalledFile *installedFile_local;
  cmLocalGenerator *lg_local;
  cmCPackPropertiesGenerator *this_local;
  
  local_28 = configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)installedFile;
  installedFile_local = (cmInstalledFile *)lg;
  lg_local = (cmLocalGenerator *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CPACK_BUILD_CONFIG",&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,local_28);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_48,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmCPackPropertiesGenerator_0167d760;
  this->LG = (cmLocalGenerator *)installedFile_local;
  this->InstalledFile = (cmInstalledFile *)configurations_local;
  (this->super_cmScriptGenerator).ActionsPerConfig = true;
  return;
}

Assistant:

cmCPackPropertiesGenerator::cmCPackPropertiesGenerator(
  cmLocalGenerator* lg, cmInstalledFile const& installedFile,
  std::vector<std::string> const& configurations)
  : cmScriptGenerator("CPACK_BUILD_CONFIG", configurations)
  , LG(lg)
  , InstalledFile(installedFile)
{
  this->ActionsPerConfig = true;
}